

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O0

int * f3_get_stem_contributions_d3
                (vrna_fold_compound_t *fc,int i,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f3 *sc_wrapper)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  vrna_param_t *p;
  code *pcVar4;
  code *pcVar5;
  short *psVar6;
  char **ptype_00;
  char *pcVar7;
  short **ppsVar8;
  uint **ppuVar9;
  uchar uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  void *pvVar17;
  int *piVar18;
  int local_d4;
  int local_c8;
  undefined1 *sc_red_stem;
  undefined1 *sc_spl_stem;
  vrna_md_t *md;
  vrna_param_t *P;
  int maxdist;
  int length;
  int *stems;
  int *c;
  int turn;
  int max_j;
  int j;
  int energy;
  uint type;
  uint **a2s;
  uint n_seq;
  uint s;
  short *si;
  short sj1;
  short **S3;
  short **S;
  short *S1;
  char **ptype;
  sc_wrapper_f3 *sc_wrapper_local;
  default_data *hc_dat_local_local;
  vrna_callback_hc_evaluate *evaluate_local;
  int i_local;
  vrna_fold_compound_t *fc_local;
  
  uVar2 = fc->length;
  iVar15 = fc->window_size;
  p = fc->params;
  lVar16 = *(long *)((fc->matrices->field_2).field_0.c + (long)i * 2) + (long)i * -4;
  iVar14 = (p->model_details).min_loop_size;
  pvVar17 = vrna_alloc(iVar15 * 4 + 0x18);
  piVar18 = (int *)((long)pvVar17 + (long)i * -4);
  pcVar4 = (code *)sc_wrapper->decomp_stem;
  pcVar5 = (code *)sc_wrapper->red_stem;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    psVar6 = (fc->field_23).field_0.sequence_encoding;
    ptype_00 = fc->ptype_local;
    if ((int)(uVar2 - 1) < i + iVar15 + 1) {
      local_c8 = uVar2 - 1;
    }
    else {
      local_c8 = i + iVar15 + 1;
    }
    turn = i + iVar14;
    while (iVar3 = turn, turn = iVar3 + 1, turn <= local_c8) {
      piVar18[turn] = 10000000;
      if ((*(int *)(lVar16 + (long)iVar3 * 4) != 10000000) &&
         (uVar10 = (*evaluate)(i,uVar2,iVar3,iVar3 + 2,'\x10',hc_dat_local), uVar10 != '\0')) {
        uVar11 = vrna_get_ptype_window(i,iVar3,ptype_00);
        iVar3 = *(int *)(lVar16 + (long)iVar3 * 4);
        iVar13 = vrna_E_ext_stem(uVar11,-1,(int)psVar6[turn],p);
        piVar18[turn] = iVar3 + iVar13;
      }
    }
    if (pcVar4 != (code *)0x0) {
      turn = i + iVar14;
      while (iVar14 = turn, turn = iVar14 + 1, turn <= local_c8) {
        if (piVar18[turn] != 10000000) {
          iVar14 = (*pcVar4)(i,iVar14,iVar14 + 2,sc_wrapper);
          piVar18[turn] = iVar14 + piVar18[turn];
        }
      }
    }
    if ((((int)uVar2 <= i + iVar15) && (*(int *)(lVar16 + (long)(int)(uVar2 - 1) * 4) != 10000000))
       && (uVar10 = (*evaluate)(i,uVar2,i,uVar2 - 1,'\x0e',hc_dat_local), uVar10 != '\0')) {
      uVar11 = vrna_get_ptype_window(i,uVar2 - 1,ptype_00);
      iVar15 = *(int *)(lVar16 + (long)(int)(uVar2 - 1) * 4);
      iVar14 = vrna_E_ext_stem(uVar11,-1,(int)psVar6[(int)uVar2],p);
      piVar18[(int)uVar2] = iVar15 + iVar14;
      if (pcVar5 != (code *)0x0) {
        iVar15 = (*pcVar5)(i,i,uVar2 - 1,sc_wrapper);
        piVar18[(int)uVar2] = iVar15 + piVar18[(int)uVar2];
      }
    }
  }
  else if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    uVar11 = (fc->field_23).field_1.n_seq;
    pcVar7 = (fc->field_23).field_0.ptype_pf_compat;
    ppsVar8 = (fc->field_23).field_1.S3;
    ppuVar9 = (fc->field_23).field_1.a2s;
    if ((int)(uVar2 - 1) < i + iVar15 + 1) {
      local_d4 = uVar2 - 1;
    }
    else {
      local_d4 = i + iVar15 + 1;
    }
    pvVar17 = vrna_alloc(uVar11 << 1);
    for (a2s._4_4_ = 0; a2s._4_4_ < uVar11; a2s._4_4_ = a2s._4_4_ + 1) {
      *(undefined2 *)((long)pvVar17 + (ulong)a2s._4_4_ * 2) =
           *(undefined2 *)(*(long *)(pcVar7 + (ulong)a2s._4_4_ * 8) + (long)i * 2);
    }
    turn = i + iVar14;
    while (iVar3 = turn, turn = iVar3 + 1, turn <= local_d4) {
      piVar18[turn] = 10000000;
      if ((*(int *)(lVar16 + (long)iVar3 * 4) != 10000000) &&
         (uVar10 = (*evaluate)(i,uVar2,iVar3,iVar3 + 2,'\x10',hc_dat_local), uVar10 != '\0')) {
        max_j = *(int *)(lVar16 + (long)iVar3 * 4);
        for (a2s._4_4_ = 0; a2s._4_4_ < uVar11; a2s._4_4_ = a2s._4_4_ + 1) {
          uVar12 = vrna_get_ptype_md((int)*(short *)((long)pvVar17 + (ulong)a2s._4_4_ * 2),
                                     (int)*(short *)(*(long *)(pcVar7 + (ulong)a2s._4_4_ * 8) +
                                                    (long)iVar3 * 2),&p->model_details);
          if (ppuVar9[a2s._4_4_][iVar3] < ppuVar9[a2s._4_4_][(int)uVar2]) {
            sVar1 = ppsVar8[a2s._4_4_][iVar3];
          }
          else {
            sVar1 = -1;
          }
          iVar13 = vrna_E_ext_stem(uVar12,-1,(int)sVar1,p);
          max_j = iVar13 + max_j;
        }
        piVar18[turn] = max_j;
      }
    }
    if (pcVar4 != (code *)0x0) {
      turn = i + iVar14;
      while (iVar14 = turn, turn = iVar14 + 1, turn <= local_d4) {
        if (piVar18[turn] != 10000000) {
          iVar14 = (*pcVar4)(i,iVar14,iVar14 + 2,sc_wrapper);
          piVar18[turn] = iVar14 + piVar18[turn];
        }
      }
    }
    if ((((int)uVar2 <= i + iVar15) && (*(int *)(lVar16 + (long)(int)(uVar2 - 1) * 4) != 10000000))
       && (uVar10 = (*evaluate)(i,uVar2,i,uVar2 - 1,'\x0e',hc_dat_local), uVar10 != '\0')) {
      max_j = *(int *)(lVar16 + (long)(int)(uVar2 - 1) * 4);
      for (a2s._4_4_ = 0; a2s._4_4_ < uVar11; a2s._4_4_ = a2s._4_4_ + 1) {
        uVar12 = vrna_get_ptype_md((int)*(short *)((long)pvVar17 + (ulong)a2s._4_4_ * 2),
                                   (int)*(short *)(*(long *)(pcVar7 + (ulong)a2s._4_4_ * 8) +
                                                  (long)(int)(uVar2 - 1) * 2),&p->model_details);
        if (ppuVar9[a2s._4_4_][(int)(uVar2 - 1)] < ppuVar9[a2s._4_4_][(int)uVar2]) {
          sVar1 = ppsVar8[a2s._4_4_][(int)(uVar2 - 1)];
        }
        else {
          sVar1 = -1;
        }
        iVar15 = vrna_E_ext_stem(uVar12,-1,(int)sVar1,p);
        max_j = iVar15 + max_j;
      }
      if (pcVar5 != (code *)0x0) {
        iVar15 = (*pcVar5)(i,i,uVar2 - 1,sc_wrapper);
        max_j = iVar15 + max_j;
      }
      piVar18[(int)uVar2] = max_j;
    }
    free(pvVar17);
  }
  return piVar18;
}

Assistant:

int *
f3_get_stem_contributions_d3(vrna_fold_compound_t       *fc,
                             int                        i,
                             vrna_callback_hc_evaluate  *evaluate,
                             struct default_data        *hc_dat_local,
                             struct sc_wrapper_f3       *sc_wrapper)
{
  char                    **ptype;
  short                   *S1, **S, **S3, sj1, *si;
  unsigned int            s, n_seq, **a2s, type;
  int                     energy, j, max_j, turn, *c, *stems, length, maxdist;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f3_split_in_ext_stem *sc_spl_stem;
  sc_f3_reduce_to_stem    *sc_red_stem;

  length  = (int)fc->length;
  maxdist = fc->window_size;
  P       = fc->params;
  md      = &(P->model_details);
  c       = fc->matrices->c_local[i];
  c       -= i;
  turn    = md->min_loop_size;

  stems = (int *)vrna_alloc(sizeof(int) * (maxdist + 6));
  stems -= i;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      S1    = fc->sequence_encoding;
      ptype = fc->ptype_local;
      max_j = MIN2(length - 1, i + maxdist + 1);

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j - 1] != INF) &&
            (evaluate(i, length, j - 1, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j - 1, ptype);
          stems[j]  = c[j - 1] +
                      vrna_E_ext_stem(type, -1, S1[j], P);
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j - 1, j + 1, sc_wrapper);

      if (length <= i + maxdist) {
        j = length;

        if ((c[j - 1] != INF) &&
            (evaluate(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          type      = vrna_get_ptype_window(i, j - 1, ptype);
          stems[j]  = c[j - 1] +
                      vrna_E_ext_stem(type, -1, S1[j], P);

          if (sc_red_stem)
            stems[j] += sc_red_stem(i, i, j - 1, sc_wrapper);
        }
      }

      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      n_seq = fc->n_seq;
      S     = fc->S;
      S3    = fc->S3;
      a2s   = fc->a2s;
      max_j = MIN2(length - 1, i + maxdist + 1);

      si = (short *)vrna_alloc(sizeof(short) * n_seq);
      for (s = 0; s < n_seq; s++)
        si[s] = S[s][i];

      for (j = i + turn + 1; j <= max_j; j++) {
        stems[j] = INF;
        if ((c[j - 1] != INF) &&
            (evaluate(i, length, j - 1, j + 1, VRNA_DECOMP_EXT_STEM_EXT, hc_dat_local))) {
          energy = c[j - 1];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j - 1], md);
            sj1     = (a2s[s][j - 1] < a2s[s][length]) ? S3[s][j - 1] : -1;
            energy  += vrna_E_ext_stem(type, -1, sj1, P);
          }
          stems[j] = energy;
        }
      }

      if (sc_spl_stem)
        for (j = i + turn + 1; j <= max_j; j++)
          if (stems[j] != INF)
            stems[j] += sc_spl_stem(i, j - 1, j + 1, sc_wrapper);

      if (length <= i + maxdist) {
        j = length;

        if ((c[j - 1] != INF) &&
            (evaluate(i, j, i, j - 1, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
          energy = c[j - 1];
          for (s = 0; s < n_seq; s++) {
            type    = vrna_get_ptype_md(si[s], S[s][j - 1], md);
            sj1     = (a2s[s][j - 1] < a2s[s][length]) ? S3[s][j - 1] : -1;
            energy  += vrna_E_ext_stem(type, -1, sj1, P);
          }

          if (sc_red_stem)
            energy += sc_red_stem(i, i, j - 1, sc_wrapper);

          stems[j] = energy;
        }
      }

      free(si);

      break;
  }

  return stems;
}